

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mspm.cpp
# Opt level: O3

void __thiscall pg::MSPMSolver::solve(MSPMSolver *this,int node,int str)

{
  Game *pGVar1;
  ostream *poVar2;
  long *plVar3;
  long lVar4;
  Error *this_00;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int *piVar9;
  int node_00;
  int iVar10;
  int *piVar11;
  uint win;
  long lVar12;
  int from;
  queue<int,_std::deque<int,_std::allocator<int>_>_> q;
  int local_90;
  int local_8c;
  _Deque_base<int,_std::allocator<int>_> local_88;
  
  iVar7 = this->pms[(long)this->k * (long)node];
  local_90 = node;
  if ((this->pms + (long)this->k * (long)node)[iVar7 != -1] != -1) {
    this_00 = (Error *)__cxa_allocate_exception(0x40);
    Error::Error(this_00,"logic error",
                 "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/mspm.cpp"
                 ,0xef);
    __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
  }
  if ((this->super_Solver).trace != 0) {
    poVar2 = (this->super_Solver).logger;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"Detected \x1b[1;31mTop\x1b[m from ",0x1c);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,node);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"/",1);
    poVar2 = (ostream *)
             std::ostream::operator<<(poVar2,((this->super_Solver).game)->_priority[node]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," to ",4);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,str);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"/",1);
    plVar3 = (long *)std::ostream::operator<<(poVar2,((this->super_Solver).game)->_priority[str]);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
  }
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (int *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (int *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (int *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (int *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_88,0);
  iVar5 = -1;
  if ((((((this->super_Solver).game)->_owner)._bits[(ulong)(long)local_90 >> 6] >>
        ((long)local_90 & 0x3fU) & 1) == 0) != (iVar7 != -1)) {
    iVar5 = str;
  }
  win = (uint)(iVar7 != -1);
  Oink::solve((this->super_Solver).oink,local_90,win,iVar5);
  this->cover[local_90] = -1;
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
              ((deque<int,std::allocator<int>> *)&local_88,&local_90);
  }
  else {
    *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_90;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  todo_push(this,local_90);
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      iVar5 = *local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_88._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_88._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_88._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_88._M_impl.super__Deque_impl_data._M_start._M_last =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 0x80;
        local_88._M_impl.super__Deque_impl_data._M_start._M_first =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_88._M_impl.super__Deque_impl_data._M_start._M_node =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      pGVar1 = (this->super_Solver).game;
      piVar11 = pGVar1->_inedges;
      iVar6 = pGVar1->_firstins[iVar5];
      node_00 = piVar11[iVar6];
      if (node_00 != -1) {
        piVar11 = piVar11 + iVar6;
        do {
          uVar8 = (ulong)node_00;
          local_8c = node_00;
          if ((this->cover[uVar8] == 0) &&
             (pGVar1 = (this->super_Solver).game,
             pGVar1->_priority[uVar8] <= pGVar1->_priority[local_90])) {
            iVar6 = iVar5;
            if ((((pGVar1->_owner)._bits[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0) == (iVar7 != -1))
            {
              iVar6 = -1;
              iVar10 = pGVar1->_outedges[pGVar1->_firstouts[uVar8]];
              if (iVar10 != -1) {
                piVar9 = pGVar1->_outedges + (long)pGVar1->_firstouts[uVar8] + 1;
                do {
                  if (-1 < this->cover[iVar10]) goto LAB_0016ae4c;
                  iVar10 = *piVar9;
                  piVar9 = piVar9 + 1;
                } while (iVar10 != -1);
              }
            }
            Oink::solve((this->super_Solver).oink,node_00,win,iVar6);
            this->cover[local_8c] = -1;
            this->pms[(int)(local_8c * this->k + win)] = -1;
            if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
              std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                        ((deque<int,std::allocator<int>> *)&local_88,&local_8c);
            }
            else {
              *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_8c;
              local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
            }
            todo_push(this,local_8c);
          }
LAB_0016ae4c:
          node_00 = piVar11[1];
          piVar11 = piVar11 + 1;
        } while (node_00 != -1);
      }
    } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  iVar7 = this->coverdepth + 1;
  this->coverdepth = iVar7;
  coverlower(this,local_90,iVar7);
  if (0 < (this->super_Solver).trace) {
    poVar2 = (this->super_Solver).logger;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Cover status:",0xd);
    std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    lVar4 = ((this->super_Solver).game)->n_vertices;
    if (0 < lVar4) {
      lVar12 = 0;
      do {
        if (this->cover[lVar12] != 0) {
          poVar2 = (ostream *)std::ostream::operator<<((this->super_Solver).logger,(int)lVar12);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"/",1);
          poVar2 = (ostream *)
                   std::ostream::operator<<(poVar2,((this->super_Solver).game)->_priority[lVar12]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
          plVar3 = (long *)std::ostream::operator<<(poVar2,this->cover[lVar12]);
          std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
          std::ostream::put((char)plVar3);
          std::ostream::flush();
          lVar4 = ((this->super_Solver).game)->n_vertices;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < lVar4);
    }
  }
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_88);
  return;
}

Assistant:

void
MSPMSolver::solve(int node, int str)
{
    int *pm = pms + k*node;
    const int pl = pm[0] == -1 ? 0 : 1;
    if (pm[pl] != -1) LOGIC_ERROR;

    if (trace) logger << "Detected \033[1;31mTop\033[m from " << node << "/" << priority(node) << " to " << str << "/" << priority(str) << std::endl;

    // initialize
    std::queue<int> q;

    // solve <node>
    Solver::solve(node, pl, owner(node) == pl ? str : -1);
    // if (pl == (priority(node)&1)) counts[priority(node)]--;
    cover[node] = -1;
    q.push(node);
    todo_push(node);

    // attract within uncovered area to <node> for <pl>
    while (!q.empty()) {
        int n = q.front();
        q.pop();
        for (auto curedge = ins(n); *curedge != -1; curedge++) {
            int from = *curedge;
            // logger << "trying edge " << from << "/" << priority(from) << " to " << n << std::endl;
            if (cover[from]) continue;
            if (priority(from) > priority(node)) continue;
            if (owner(from) != pl) {
                bool escapes = false;
                for (auto curedge = outs(from); *curedge != -1; curedge++) {
                    int to = *curedge;
                    if (cover[to] < 0) continue; // disabled or already solved
                    // if (cover[to] != 0) LOGIC_ERROR; // should have been covered
                    // ^--- it can escape, happens when alternating!
                    escapes = true;
                    break;
                }
                if (escapes) continue;
            }
            Solver::solve(from, pl, owner(from) == pl ? n : -1);
            // if (winner == (priority(from)&1)) counts[priority(from)]--;
            cover[from] = -1;
            pms[k*from+pl] = -1;
            q.push(from);
            todo_push(from);
        }
    }

    // after lifting, cover everything that is lower
    coverlower(node, ++coverdepth);

    if (trace >= 1) {
        logger << "Cover status:" << std::endl;
        for (int i=0; i<nodecount(); i++) {
            if (cover[i]) logger << i << "/" << priority(i) << ": " << cover[i] << std::endl;
        }
    }
}